

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     sar<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,uint8_t count,Context *context)

{
  unsigned_short uVar1;
  ushort uVar2;
  int iVar3;
  undefined2 local_30;
  unsigned_short mask;
  unsigned_short sign;
  Context *context_local;
  uint8_t count_local;
  modify_t<unsigned_short> destination_local;
  
  if (count != '\0') {
    uVar1 = Numeric::top_bit<unsigned_short>();
    uVar2 = uVar1 & *destination;
    iVar3 = Numeric::bit_size<unsigned_short>();
    if ((int)(uint)count < iVar3) {
      Flags::set_from<(InstructionSet::x86::Flag)0>
                (&context->flags,(uint)(*destination & (ushort)(1 << (count - 1 & 0x1f))));
      if (uVar2 == 0) {
        local_30 = (ushort)(0 >> (count & 0x1f));
      }
      else {
        local_30 = (ushort)(0xffff >> (count & 0x1f)) ^ 0xffff;
      }
      *destination = (ushort)((int)(uint)*destination >> (count & 0x1f)) | local_30;
    }
    else {
      uVar1 = 0;
      if (uVar2 != 0) {
        uVar1 = 0xffff;
      }
      *destination = uVar1;
      Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)uVar2);
    }
    Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,0);
    Flags::
    set_from<unsigned_short,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)8>
              (&context->flags,*destination);
  }
  return;
}

Assistant:

void sar(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	if(!count) {
		return;
	}

	const IntT sign = Numeric::top_bit<IntT>() & destination;
	if(count >= Numeric::bit_size<IntT>()) {
		destination = sign ? IntT(~0) : IntT(0);
		context.flags.template set_from<Flag::Carry>(sign);
	} else {
		const auto mask = IntT(1 << (count - 1));
		context.flags.template set_from<Flag::Carry>(destination & mask);
		destination = (destination >> count) | (sign ? ~(IntT(~0) >> count) : 0);
	}
	context.flags.template set_from<Flag::Overflow>(0);
	context.flags.template set_from<IntT, Flag::Sign, Flag::Zero, Flag::ParityOdd>(destination);
}